

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void __thiscall
ON_TextureMapping::SetCustomMappingPrimitive(ON_TextureMapping *this,ON_Object *pMappingObject)

{
  ON__UINT32 mapping_crc;
  ON_UserData *pOVar1;
  MappingCRCCache *this_00;
  ON_UUID local_30;
  
  if (pMappingObject != (ON_Object *)0x0) {
    mapping_crc = ::MappingCRC(pMappingObject);
    local_30 = ON_ClassId::Uuid(&MappingCRCCache::m_MappingCRCCache_class_rtti);
    pOVar1 = ON_Object::GetUserData(pMappingObject,&local_30);
    if (pOVar1 != (ON_UserData *)0x0) {
      *(ON__UINT32 *)&pOVar1[1].super_ON_Object._vptr_ON_Object = mapping_crc;
    }
    this_00 = (MappingCRCCache *)operator_new(0xd0);
    MappingCRCCache::MappingCRCCache(this_00,mapping_crc);
    ON_Object::AttachUserData(pMappingObject,(ON_UserData *)this_00);
  }
  std::__shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>::reset<ON_Object>
            (&(this->m_mapping_primitive).
              super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>,pMappingObject);
  return;
}

Assistant:

void ON_TextureMapping::SetCustomMappingPrimitive(ON_Object* pMappingObject)
{
  if (nullptr != pMappingObject)
  {
    const auto mapping_crc = ::MappingCRC(pMappingObject);

    if (auto* pUD = static_cast<MappingCRCCache*>(pMappingObject->GetUserData(ON_CLASS_ID(MappingCRCCache))))
    {
      pUD->m_mapping_crc = mapping_crc;
    }

    pMappingObject->AttachUserData(new MappingCRCCache(mapping_crc));
  }

  m_mapping_primitive.reset(pMappingObject);
}